

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

bool __thiscall deqp::gles3::Functional::TextureSizeCase::initShader(TextureSizeCase *this)

{
  bool bVar1;
  RenderContext *renderCtx;
  ShaderProgram *this_00;
  string fragSrc;
  string vertSrc;
  ProgramSources local_f0;
  
  genVertexShader_abi_cxx11_(&vertSrc,this);
  genFragmentShader_abi_cxx11_(&fragSrc,this);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  glu::makeVtxFragSources(&local_f0,&vertSrc,&fragSrc);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_f0);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_f0);
  glu::operator<<(((this->super_TestCase).m_context)->m_testCtx->m_log,this->m_program);
  bVar1 = (this->m_program->m_program).m_info.linkOk;
  if (bVar1 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Shader failed");
  }
  std::__cxx11::string::~string((string *)&fragSrc);
  std::__cxx11::string::~string((string *)&vertSrc);
  return bVar1;
}

Assistant:

bool TextureSizeCase::initShader (void)
{
	const std::string		vertSrc = genVertexShader();
	const std::string		fragSrc = genFragmentShader();

	DE_ASSERT(m_program == DE_NULL);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertSrc, fragSrc));
	m_context.getTestContext().getLog() << *m_program;

	if (!m_program->isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Shader failed");
		return false;
	}

	return true;
}